

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

Block * __thiscall
wasm::I64ToI32Lowering::makeSmallShl
          (I64ToI32Lowering *this,Index highBits,Index leftLow,Index leftHigh,Index shift,
          Binary *shiftMask,Binary *widthLessShift)

{
  Index IVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  LocalGet *pLVar5;
  Binary *right;
  LocalGet *pLVar6;
  Binary *pBVar7;
  LocalSet *any;
  Block *pBVar8;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Binary *local_40;
  Binary *shiftHigh;
  Binary *local_30;
  Binary *shiftedInBits;
  Binary *shiftMask_local;
  Index shift_local;
  Index leftHigh_local;
  Index leftLow_local;
  Index highBits_local;
  I64ToI32Lowering *this_local;
  
  shiftedInBits = shiftMask;
  shiftMask_local._0_4_ = shift;
  shiftMask_local._4_4_ = leftHigh;
  shift_local = leftLow;
  leftHigh_local = highBits;
  _leftLow_local = this;
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar7 = shiftedInBits;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shift_local;
  wasm::Type::Type((Type *)&shiftHigh,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar1,(Type)shiftHigh);
  right = Builder::makeBinary(pBVar3,ShrUInt32,(Expression *)pLVar5,(Expression *)widthLessShift);
  local_30 = Builder::makeBinary(pBVar2,AndInt32,(Expression *)pBVar7,(Expression *)right);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shiftMask_local._4_4_;
  wasm::Type::Type(&local_48,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_48);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = (Index)shiftMask_local;
  wasm::Type::Type(&local_50,i32);
  pLVar6 = Builder::makeLocalGet(pBVar3,IVar1,local_50);
  local_40 = Builder::makeBinary(pBVar2,ShlInt32,(Expression *)pLVar5,(Expression *)pLVar6);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = leftHigh_local;
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar7 = Builder::makeBinary(pBVar4,OrInt32,(Expression *)local_30,(Expression *)local_40);
  any = Builder::makeLocalSet(pBVar3,IVar1,(Expression *)pBVar7);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = shift_local;
  wasm::Type::Type(&local_58,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,IVar1,local_58);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = (Index)shiftMask_local;
  wasm::Type::Type(&local_60,i32);
  pLVar6 = Builder::makeLocalGet(pBVar4,IVar1,local_60);
  pBVar7 = Builder::makeBinary(pBVar3,ShlInt32,(Expression *)pLVar5,(Expression *)pLVar6);
  pBVar8 = Builder::blockify(pBVar2,(Expression *)any,(Expression *)pBVar7);
  return pBVar8;
}

Assistant:

Block* makeSmallShl(Index highBits,
                      Index leftLow,
                      Index leftHigh,
                      Index shift,
                      Binary* shiftMask,
                      Binary* widthLessShift) {
    Binary* shiftedInBits = builder->makeBinary(
      AndInt32,
      shiftMask,
      builder->makeBinary(
        ShrUInt32, builder->makeLocalGet(leftLow, Type::i32), widthLessShift));
    Binary* shiftHigh =
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32));
    return builder->blockify(
      builder->makeLocalSet(
        highBits, builder->makeBinary(OrInt32, shiftedInBits, shiftHigh)),
      builder->makeBinary(ShlInt32,
                          builder->makeLocalGet(leftLow, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }